

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::enforceNoDuplicateTestCases
               (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *functions)

{
  bool bVar1;
  ostream *poVar2;
  pointer pTVar3;
  pointer this;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> pVar4;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> prev;
  const_iterator itEnd;
  const_iterator it;
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> seenFunctions;
  undefined4 in_stack_ffffffffffffff08;
  Code in_stack_ffffffffffffff0c;
  ostream *in_stack_ffffffffffffff10;
  value_type *in_stack_ffffffffffffff28;
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
  *in_stack_ffffffffffffff30;
  Colour local_79;
  _Base_ptr local_78;
  undefined1 local_70;
  _Base_ptr local_58;
  undefined1 local_50;
  TestCase *local_48;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_40 [8];
  
  std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::set
            ((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
             0x17a43c);
  local_40[0]._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_48 = (TestCase *)
             std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                       ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                        CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (!bVar1) {
      std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::~set
                ((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                  *)0x17a6ac);
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator*(local_40);
    pVar4 = std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
            ::insert(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_78 = (_Base_ptr)pVar4.first._M_node;
    local_70 = pVar4.second;
    local_58 = local_78;
    local_50 = local_70;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(local_40);
  }
  poVar2 = cerr();
  Colour::Colour((Colour *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  poVar2 = operator<<(poVar2,&local_79);
  poVar2 = std::operator<<(poVar2,"error: TEST_CASE( \"");
  pTVar3 = __gnu_cxx::
           __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
           ::operator->(local_40);
  poVar2 = std::operator<<(poVar2,(string *)pTVar3);
  poVar2 = std::operator<<(poVar2,"\" ) already defined.\n");
  std::operator<<(poVar2,"\tFirst seen at ");
  this = std::_Rb_tree_const_iterator<Catch::TestCase>::operator->
                   ((_Rb_tree_const_iterator<Catch::TestCase> *)0x17a599);
  TestCase::getTestCaseInfo(this);
  poVar2 = operator<<(in_stack_ffffffffffffff10,
                      (SourceLineInfo *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"\tRedefined at ");
  pTVar3 = __gnu_cxx::
           __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
           ::operator->(local_40);
  TestCase::getTestCaseInfo(pTVar3);
  poVar2 = operator<<(in_stack_ffffffffffffff10,
                      (SourceLineInfo *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Colour::~Colour((Colour *)0x17a64b);
  exit(1);
}

Assistant:

void enforceNoDuplicateTestCases( std::vector<TestCase> const& functions ) {
        std::set<TestCase> seenFunctions;
        for( std::vector<TestCase>::const_iterator it = functions.begin(), itEnd = functions.end();
            it != itEnd;
            ++it ) {
            std::pair<std::set<TestCase>::const_iterator, bool> prev = seenFunctions.insert( *it );
            if( !prev.second ){
                Catch::cerr()
                << Colour( Colour::Red )
                << "error: TEST_CASE( \"" << it->name << "\" ) already defined.\n"
                << "\tFirst seen at " << prev.first->getTestCaseInfo().lineInfo << "\n"
                << "\tRedefined at " << it->getTestCaseInfo().lineInfo << std::endl;
                exit(1);
            }
        }
    }